

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  double dVar8;
  string text;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-","");
  bVar4 = TryConsume(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  TVar2 = (this->tokenizer_).current_.type;
  if (TVar2 == TYPE_IDENTIFIER) {
    pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + (this->tokenizer_).current_.text._M_string_length
              );
    if (local_70._M_string_length != 0) {
      sVar7 = 0;
      do {
        if ((byte)(local_70._M_dataplus._M_p[sVar7] + 0xbfU) < 0x1a) {
          local_70._M_dataplus._M_p[sVar7] = local_70._M_dataplus._M_p[sVar7] | 0x20;
        }
        sVar7 = sVar7 + 1;
      } while (local_70._M_string_length != sVar7);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_70);
    dVar8 = INFINITY;
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)&local_70);
      dVar8 = INFINITY;
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar6 != 0) {
          std::operator+(&local_50,"Expected double, got: ",&local_70);
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      &local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          goto LAB_002a5867;
        }
        dVar8 = NAN;
      }
    }
    *value = dVar8;
    io::Tokenizer::Next(&this->tokenizer_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    if (TVar2 == TYPE_INTEGER) {
      bVar5 = ConsumeUnsignedDecimalAsDouble(this,value,0xffffffffffffffff);
      if (!bVar4 || !bVar5) {
        return bVar5;
      }
      goto LAB_002a58a4;
    }
    if (TVar2 != TYPE_FLOAT) {
      std::operator+(&local_70,"Expected double, got: ",&(this->tokenizer_).current_.text);
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_70
                 );
LAB_002a5867:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return false;
    }
    dVar8 = io::Tokenizer::ParseFloat(&(this->tokenizer_).current_.text);
    *value = dVar8;
    io::Tokenizer::Next(&this->tokenizer_);
  }
  if (!bVar4) {
    return true;
  }
LAB_002a58a4:
  *value = -*value;
  return true;
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      DO(ConsumeUnsignedDecimalAsDouble(value, kuint64max));
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError("Expected double, got: " + text);
        return false;
      }
    } else {
      ReportError("Expected double, got: " + tokenizer_.current().text);
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }